

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O0

ActionResultHolder<ot::commissioner::Error> *
testing::internal::ActionResultHolder<ot::commissioner::Error>::
PerformAction<ot::commissioner::Error()>
          (Action<ot::commissioner::Error_()> *action,ArgumentTuple *args)

{
  ActionResultHolder<ot::commissioner::Error> *this;
  Error local_68;
  ReferenceOrValueWrapper<ot::commissioner::Error> local_40;
  ArgumentTuple *local_18;
  ArgumentTuple *args_local;
  Action<ot::commissioner::Error_()> *action_local;
  
  local_18 = args;
  args_local = (ArgumentTuple *)action;
  this = (ActionResultHolder<ot::commissioner::Error> *)operator_new(0x30);
  Action<ot::commissioner::Error_()>::Perform
            (&local_68,(Action<ot::commissioner::Error_()> *)args_local);
  ReferenceOrValueWrapper<ot::commissioner::Error>::ReferenceOrValueWrapper(&local_40,&local_68);
  ActionResultHolder(this,&local_40);
  ReferenceOrValueWrapper<ot::commissioner::Error>::~ReferenceOrValueWrapper(&local_40);
  ot::commissioner::Error::~Error(&local_68);
  return this;
}

Assistant:

static ActionResultHolder* PerformAction(
      const Action<F>& action, typename Function<F>::ArgumentTuple&& args) {
    return new ActionResultHolder(
        Wrapper(action.Perform(std::move(args))));
  }